

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.h
# Opt level: O2

string * TestSuite::getInfoMsg_abi_cxx11_(void)

{
  long lVar1;
  long *in_FS_OFFSET;
  
  if (*(char *)(*in_FS_OFFSET + -0x1360) == '\0') {
    lVar1 = *in_FS_OFFSET;
    *(long *)(lVar1 + -0x1380) = lVar1 + -0x1370;
    *(undefined8 *)(lVar1 + -0x1378) = 0;
    *(undefined1 *)(lVar1 + -0x1370) = 0;
    __cxa_thread_atexit(std::__cxx11::string::~string,(long *)(lVar1 + -0x1380),&__dso_handle);
    *(undefined1 *)(*in_FS_OFFSET + -0x1360) = 1;
  }
  return (string *)(*in_FS_OFFSET + -0x1380);
}

Assistant:

static std::string& getInfoMsg() {
        thread_local std::string info_msg;
        return info_msg;
    }